

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void runExperiment(cpu_set_t *cpuset,int numOfThreads,int repeat,bool useTraditional)

{
  size_t __n;
  uint *__arg;
  pthread_t *__newthread;
  pthread_t pVar1;
  long *plVar2;
  __cpu_mask *p_Var3;
  int iVar4;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  undefined7 in_register_00000009;
  code *__start_routine;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined8 uStack_70;
  uint auStack_68 [2];
  cpu_set_t *local_60;
  long local_58;
  ulong local_50;
  int local_44;
  long local_40;
  int local_34;
  
  local_34 = (int)CONCAT71(in_register_00000009,useTraditional);
  local_50 = (ulong)(uint)numOfThreads;
  local_40 = (long)auStack_68 - (local_50 * 8 + 0xf & 0xfffffffffffffff0);
  lVar12 = local_40 - (local_50 * 4 + 0xf & 0xfffffffffffffff0);
  lVar10 = (long)numOfThreads;
  uVar9 = 0xffffffffffffffff;
  if (0 < numOfThreads) {
    uVar9 = lVar10 * 8;
  }
  local_60 = cpuset;
  local_44 = numOfThreads;
  *(undefined8 *)(lVar12 + -8) = 0x102bbd;
  plVar6 = (long *)operator_new__(uVar9);
  *plVar6 = 0;
  __n = uVar9 - 8;
  *(undefined8 *)(lVar12 + -8) = 0x102bd8;
  memset(plVar6 + 1,0,__n);
  *(undefined8 *)(lVar12 + -8) = 0x102be7;
  throughputDelete = plVar6;
  plVar6 = (long *)operator_new__(uVar9);
  *plVar6 = 0;
  *(undefined8 *)(lVar12 + -8) = 0x102bfe;
  memset(plVar6 + 1,0,__n);
  *(undefined8 *)(lVar12 + -8) = 0x102c0d;
  throughputInsert = plVar6;
  plVar6 = (long *)operator_new__(uVar9);
  *plVar6 = 0;
  *(undefined8 *)(lVar12 + -8) = 0x102c23;
  memset(plVar6 + 1,0,__n);
  __start_routine = RunCPQExperiment;
  if (local_34 != 0) {
    __start_routine = RunTraditionalPQExperiment;
  }
  throughputRandom = plVar6;
  local_58 = lVar10;
  if (0 < numOfThreads) {
    uVar9 = 0;
    do {
      lVar10 = local_40;
      __arg = (uint *)(lVar12 + uVar9 * 4);
      *__arg = (uint)uVar9;
      __newthread = (pthread_t *)(lVar10 + uVar9 * 8);
      *(undefined8 *)(lVar12 + -8) = 0x102c68;
      iVar4 = pthread_create(__newthread,(pthread_attr_t *)0x0,__start_routine,__arg);
      pVar1 = *__newthread;
      p_Var3 = local_60->__bits;
      *(undefined8 *)(lVar12 + -8) = 0x102c84;
      iVar5 = pthread_setaffinity_np
                        (pVar1,0x80,(cpu_set_t *)((long)p_Var3 + (ulong)(((uint)uVar9 & 7) << 7)));
      if (iVar5 != 0) {
        *(undefined8 *)(lVar12 + -8) = 0x102dc1;
        printf("Thread %d affinities was not set",uVar9 & 0xffffffff);
        *(code **)(lVar12 + -8) = main;
        pthread_exit((void *)0x0);
      }
      if (iVar4 != 0) {
        *(undefined8 *)(lVar12 + -8) = 0x102d94;
        poVar7 = std::operator<<((ostream *)&std::cout,"Error: thread wasn\'t created,");
        *(undefined8 *)(lVar12 + -8) = 0x102d9e;
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
        *(undefined8 *)(lVar12 + -8) = 0x102da6;
        std::endl<char,std::char_traits<char>>(poVar7);
        *(undefined8 *)(lVar12 + -8) = 0x102db0;
        exit(-1);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_50);
  }
  uVar9 = local_50;
  if (local_44 < 1) {
    lVar13 = 0;
    lVar10 = 0;
    lVar11 = 0;
  }
  else {
    uVar8 = 0;
    lVar11 = 0;
    lVar10 = 0;
    lVar13 = 0;
    do {
      pVar1 = *(pthread_t *)(local_40 + uVar8 * 8);
      *(undefined8 *)(lVar12 + -8) = 0x102cc5;
      pthread_join(pVar1,(void **)0x0);
      lVar13 = lVar13 + throughputDelete[uVar8];
      lVar10 = lVar10 + throughputInsert[uVar8];
      lVar11 = lVar11 + throughputRandom[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
    lVar10 = lVar10 / 5;
    lVar13 = lVar13 / 5;
    lVar11 = lVar11 / 5;
  }
  plVar2 = throughputByThread[local_58 + -1];
  uVar9 = (ulong)((uint)(byte)((byte)local_34 ^ 1) * 0x18);
  *(long *)((long)plVar2 + uVar9) = *(long *)((long)plVar2 + uVar9) + lVar10;
  plVar6 = (long *)((long)plVar2 + uVar9 + 8);
  *plVar6 = *plVar6 + lVar13;
  plVar2 = (long *)((long)plVar2 + uVar9 + 0x10);
  *plVar2 = *plVar2 + lVar11;
  return;
}

Assistant:

void runExperiment(const cpu_set_t *cpuset, int numOfThreads, int repeat, bool useTraditional) {
    pthread_t threads[numOfThreads];
    struct threadData td[numOfThreads];
    throughputDelete = new long[numOfThreads]{0};
    throughputInsert = new long[numOfThreads]{0};
    throughputRandom = new long[numOfThreads]{0};
    void *(*routine)(void *) = useTraditional ? RunTraditionalPQExperiment : RunCPQExperiment;

    for (int i = 0; i < numOfThreads; i++) {
        td[i].threadId = i;

        int rc = pthread_create(&threads[i], nullptr, routine, (void *) &td[i]);

        int s = pthread_setaffinity_np(threads[i], sizeof(cpu_set_t), &cpuset[i % CORES]);
        if (s != 0) {
            printf("Thread %d affinities was not set", i);
            pthread_exit(nullptr);
        }

        if (rc) {
            cout << "Error: thread wasn't created," << rc << endl;
            exit(-1);
        }
    }

    long throughputDeleteSum = 0;
    long throughputInsertSum = 0;
    long throughputRandomSum = 0;

    for (int i = 0; i < numOfThreads; i++) {
        pthread_join(threads[i], nullptr);

        throughputDeleteSum += throughputDelete[i];
        throughputInsertSum += throughputInsert[i];
        throughputRandomSum += throughputRandom[i];
    }

//    cout << "SUM " << (useTraditional ? "TRADITIONAL" : "RELAXED") << " THROUGHPUT PUSH: " << throughputInsertSum
//         << endl;
//    cout << "SUM " << (useTraditional ? "TRADITIONAL" : "RELAXED") << " THROUGHPUT POP: " << throughputDeleteSum
//         << endl;
//    cout << "SUM " << (useTraditional ? "TRADITIONAL" : "RELAXED") << " THROUGHPUT RANDOM: " << throughputRandomSum
//         << endl;

    int relaxedOffset = useTraditional ? 0 : 3;
    throughputByThread[numOfThreads - 1][relaxedOffset] += throughputInsertSum / REPEATS;
    throughputByThread[numOfThreads - 1][relaxedOffset + 1] += throughputDeleteSum / REPEATS;
    throughputByThread[numOfThreads - 1][relaxedOffset + 2] += throughputRandomSum / REPEATS;

//    delete throughputDelete;
//    delete throughputInsert;
//    delete throughputRandom;
}